

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

int cJSON_strcasecmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  byte *local_20;
  char *s2_local;
  char *s1_local;
  
  if (s1 == (char *)0x0) {
    s1_local._4_4_ = (uint)(s2 != (char *)0x0);
  }
  else {
    local_20 = (byte *)s2;
    s2_local = s1;
    if (s2 == (char *)0x0) {
      s1_local._4_4_ = 1;
    }
    else {
      while( true ) {
        iVar1 = tolower((int)*s2_local);
        iVar2 = tolower((int)(char)*local_20);
        if (iVar1 != iVar2) break;
        if (*s2_local == '\0') {
          return 0;
        }
        s2_local = s2_local + 1;
        local_20 = local_20 + 1;
      }
      iVar1 = tolower((uint)(byte)*s2_local);
      iVar2 = tolower((uint)*local_20);
      s1_local._4_4_ = iVar1 - iVar2;
    }
  }
  return s1_local._4_4_;
}

Assistant:

static int cJSON_strcasecmp(const char *s1,const char *s2)
{
	if (!s1) return (s1==s2)?0:1;if (!s2) return 1;
	for(; tolower(*s1) == tolower(*s2); ++s1, ++s2)	if(*s1 == 0)	return 0;
	return tolower(*(const unsigned char *)s1) - tolower(*(const unsigned char *)s2);
}